

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O3

bson_type_t bson_iter_type(bson_iter_t *iter)

{
  uint8_t **ppuVar1;
  size_t *psVar2;
  byte bVar3;
  uint8_t uVar4;
  size_t sVar5;
  double dVar6;
  long lVar7;
  int64_t iVar8;
  _Bool _Var9;
  uint uVar10;
  bson_type_t extraout_EAX;
  bson_type_t bVar11;
  uint uVar12;
  int iVar13;
  void *pvVar14;
  undefined8 uVar15;
  long lVar16;
  size_t sVar17;
  ulong uVar18;
  char *pcVar19;
  code *pcVar20;
  bson_oid_t *pbVar21;
  char *__s;
  ulong uVar22;
  ulong *in_RCX;
  ulong uVar23;
  uint8_t *puVar24;
  int32_t iVar25;
  uint *extraout_RDX;
  int *extraout_RDX_00;
  undefined4 *extraout_RDX_01;
  ulong *extraout_RDX_02;
  bson_type_t *extraout_RDX_03;
  undefined8 extraout_RDX_04;
  bson_error_t *error;
  size_t __n;
  bson_json_destroy_cb p_Var26;
  bson_t *in_RSI;
  anon_union_24_17_78d57918_for_value *dst;
  bson_json_reader_cb num_bytes;
  size_t sVar27;
  bson_error_t *__s_00;
  bson_t *pbVar28;
  uint uVar29;
  uint uVar30;
  uint8_t *puVar31;
  uint uVar32;
  uint uVar33;
  uint32_t uVar34;
  bool bVar35;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  bson_error_t bStack_560;
  uint32_t uStack_2a0;
  _Bool _Stack_299;
  bson_t *pbStack_298;
  uint32_t uStack_290;
  uint32_t uStack_28c;
  uint8_t *puStack_288;
  char *apcStack_280 [45];
  
  if (iter == (bson_iter_t *)0x0) {
    bson_iter_type_cold_3();
LAB_001109f8:
    bson_iter_type_cold_2();
  }
  else {
    if (iter->raw == (uint8_t *)0x0) goto LAB_001109f8;
    if (iter->len != 0) {
      return (bson_type_t)iter->raw[iter->type];
    }
  }
  bson_iter_type_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    *(undefined1 *)in_RCX = 0;
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31 == (uint8_t *)0x0) {
      in_RSI->flags = 0;
      in_RSI->len = 0;
      *extraout_RDX = 0;
      return BSON_TYPE_EOD;
    }
    uVar12 = *(uint *)&(((bson_json_reader_t *)iter)->producer).cb;
    uVar33 = (uint)(((bson_json_reader_t *)iter)->producer).bytes_read;
    *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).cb + 4) = uVar33;
    *(uint *)&(((bson_json_reader_t *)iter)->producer).dcb = uVar33;
    *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).dcb + 4) = uVar33 + 1;
    ppuVar1 = &(((bson_json_reader_t *)iter)->producer).buf;
    (((bson_json_reader_t *)iter)->producer).buf = (uint8_t *)0x0;
    (((bson_json_reader_t *)iter)->producer).buf_size = 0;
    uVar29 = uVar33;
    do {
      uVar30 = uVar29;
      uVar29 = uVar30 + 1;
      if (uVar12 <= uVar29) goto LAB_00110d0d;
    } while (puVar31[uVar29] != '\0');
    uVar10 = uVar30 + 2;
    uVar18 = (ulong)uVar10;
    *(uint *)&(((bson_json_reader_t *)iter)->producer).buf = uVar10;
    *(uint8_t **)in_RSI = puVar31 + (uVar33 + 1);
    puVar24 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    bVar3 = puVar24[uVar33];
    *extraout_RDX = (uint)bVar3;
    switch(bVar3) {
    case 0:
      break;
    case 1:
    case 9:
    case 0x11:
    case 0x12:
      uVar30 = uVar30 + 10;
      goto LAB_00110ab7;
    case 2:
    case 0xd:
    case 0xe:
      uVar33 = uVar30 + 6;
      if (uVar12 <= uVar33) break;
      *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4) = uVar33;
      uVar32 = *(uint *)(puVar24 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      if ((uVar12 - uVar29) - 5 < uVar32) break;
      uVar30 = uVar32 + uVar29 + 5;
      *(uint *)&(((bson_json_reader_t *)iter)->producer).bytes_read = uVar30;
      if (uVar32 == 0) break;
      if (uVar12 <= uVar30) goto LAB_00110d0a;
      if (puVar24[(ulong)(uVar32 - 1) + (ulong)uVar33] != '\0') {
        uVar10 = uVar32 + uVar29 + 4;
        goto LAB_00110d0a;
      }
      goto LAB_00110aba;
    case 3:
    case 4:
      if ((uVar10 < uVar12 - 4) &&
         (uVar33 = *(uint *)(puVar24 + *(uint *)ppuVar1), uVar33 <= uVar12)) {
        if (~uVar29 + uVar12 < uVar33) goto LAB_00110d0a;
        uVar30 = uVar33 + uVar29 + 1;
        goto LAB_00110ab7;
      }
      break;
    case 5:
      if (uVar10 < uVar12 - 4) {
        *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4) = uVar30 + 6;
        uVar32 = uVar30 + 7;
        *(uint *)&(((bson_json_reader_t *)iter)->producer).buf_size = uVar32;
        uVar33 = *(uint *)(puVar24 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        if (uVar33 < ~uVar29 + uVar12) {
          if (puVar24[uVar30 + 6] == '\x02') {
            if (uVar33 < 4) break;
            uVar10 = uVar32;
            if (*(int *)(puVar24 + uVar32) + 4U != uVar33) goto LAB_00110d0a;
          }
          uVar30 = uVar33 + uVar29 + 6;
          goto LAB_00110ab7;
        }
      }
      break;
    case 6:
    case 10:
switchD_00110a7e_caseD_6:
      *(uint32_t *)ppuVar1 = 0xffffffff;
      uVar30 = uVar10;
      goto LAB_00110ab7;
    case 7:
      uVar30 = uVar30 + 0xe;
      goto LAB_00110ab7;
    case 8:
      if ((*(uint *)ppuVar1 < uVar12) && (puVar24[*(uint *)ppuVar1] < 2)) {
        uVar30 = uVar30 + 3;
        goto LAB_00110ab7;
      }
      break;
    case 0xb:
      if (uVar10 < uVar12) {
        uVar30 = uVar30 + 3;
        uVar23 = (ulong)uVar10;
        do {
          uVar18 = (ulong)uVar30;
          if (puVar31[uVar23] == '\0') {
            *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4) = uVar30;
            if (uVar30 < uVar12) {
              puVar31 = puVar31 + uVar18;
              goto LAB_00110d2e;
            }
            break;
          }
          uVar23 = uVar23 + 1;
          uVar30 = uVar30 + 1;
        } while (uVar23 < uVar12);
      }
      goto LAB_00110d3e;
    case 0xc:
      if (uVar10 < uVar12 - 4) {
        *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4) = uVar30 + 6;
        uVar33 = *(uint *)(puVar24 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        if (((ulong)uVar33 != 0) && (uVar33 <= (uVar12 - uVar29) - 5)) {
          if (puVar24[(ulong)uVar33 + 3 + (ulong)uVar10] != '\0') {
            uVar10 = uVar33 + uVar29 + 4;
            goto LAB_00110d0a;
          }
          *(uint *)&(((bson_json_reader_t *)iter)->producer).buf_size = uVar33 + uVar29 + 5;
          uVar30 = uVar33 + uVar29 + 0x11;
          goto LAB_00110ab7;
        }
      }
      break;
    case 0xf:
      if (0x12 < uVar12) {
        if (uVar12 - 0xe <= uVar10) goto LAB_00110d0a;
        uVar32 = uVar30 + 6;
        *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4) = uVar32;
        *(uint *)&(((bson_json_reader_t *)iter)->producer).buf_size = uVar30 + 10;
        uVar33 = *(uint *)(puVar24 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        if ((0xd < uVar33) && (uVar33 < ~uVar29 + uVar12)) {
          uVar30 = uVar33 + uVar29 + 1;
          *(uint *)&(((bson_json_reader_t *)iter)->producer).bytes_read = uVar30;
          if ((uVar30 < uVar12) && (uVar33 = *(uint *)(puVar24 + uVar32), uVar33 != 0)) {
            if (((uVar12 - uVar29) - 9 <= uVar33) ||
               (uVar10 = uVar32, uVar30 <= uVar33 + uVar29 + 0xd)) goto LAB_00110d0a;
            uVar10 = uVar33 + uVar29 + 9;
            *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).buf_size + 4) = uVar10;
            if (uVar30 != uVar29 + uVar33 + *(int *)(puVar24 + uVar10) + 9) goto LAB_00110d0a;
            goto LAB_00110aba;
          }
        }
      }
      break;
    case 0x10:
      uVar30 = uVar30 + 6;
      goto LAB_00110ab7;
    case 0x13:
      uVar30 = uVar30 + 0x12;
LAB_00110ab7:
      *(uint *)&(((bson_json_reader_t *)iter)->producer).bytes_read = uVar30;
LAB_00110aba:
      uVar10 = (uint)uVar18;
      if (uVar30 < uVar12) {
        *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) = 0;
        return (bson_type_t)CONCAT71((int7)(uVar18 >> 8),1);
      }
      goto LAB_00110d0a;
    default:
      if ((bVar3 == 0x7f) || (bVar3 == 0xff)) goto switchD_00110a7e_caseD_6;
      *(undefined1 *)in_RCX = 1;
    }
LAB_00110d0a:
    *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) = uVar10;
LAB_00110d0d:
    (((bson_json_reader_t *)iter)->producer).data = (uint8_t *)0x0;
    *(uint32_t *)&(((bson_json_reader_t *)iter)->producer).cb = 0;
    *(uint32_t *)&(((bson_json_reader_t *)iter)->producer).bytes_read = 0;
    return BSON_TYPE_EOD;
  }
  _bson_iter_next_internal_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_binary_cold_2();
  }
  else if (extraout_RDX_00 != (int *)0x0 || in_RCX == (ulong *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x05') {
      uVar12 = (uint)puVar31[*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4)]
      ;
      if (in_RSI == (bson_t *)0x0) {
        if (in_RCX == (ulong *)0x0) {
          return extraout_EAX;
        }
        iVar13 = *(int *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        *extraout_RDX_00 = iVar13;
        puVar31 = (uint8_t *)
                  ((long)(((bson_json_reader_t *)iter)->producer).data +
                  (ulong)(uint)(((bson_json_reader_t *)iter)->producer).buf_size);
        *in_RCX = (ulong)puVar31;
      }
      else {
        in_RSI->flags =
             (uint)puVar31[*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4)];
        if (in_RCX == (ulong *)0x0) {
          return extraout_EAX;
        }
        iVar13 = *(int *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        *extraout_RDX_00 = iVar13;
        puVar31 = (uint8_t *)
                  ((long)(((bson_json_reader_t *)iter)->producer).data +
                  (ulong)(uint)(((bson_json_reader_t *)iter)->producer).buf_size);
        *in_RCX = (ulong)puVar31;
        uVar12 = in_RSI->flags;
      }
      if (uVar12 == 2) {
        *extraout_RDX_00 = iVar13 + -4;
        *in_RCX = (ulong)(puVar31 + 4);
      }
    }
    else {
      if (in_RCX != (ulong *)0x0) {
        *in_RCX = 0;
      }
      if (extraout_RDX_00 != (int *)0x0) {
        *extraout_RDX_00 = 0;
      }
      if (in_RSI != (bson_t *)0x0) {
        in_RSI->flags = 0;
      }
    }
    return extraout_EAX;
  }
  bson_iter_binary_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\b') {
      return BSON_TYPE_EOD;
    }
    return (bson_type_t)
           CONCAT71((int7)((ulong)puVar31 >> 8),
                    puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).buf] != '\0');
  }
  bson_iter_bool_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    uVar12 = *(uint *)&(((bson_json_reader_t *)iter)->producer).dcb;
    uVar4 = puVar31[uVar12];
    bVar11 = (bson_type_t)CONCAT71((uint7)(uint3)(uVar12 >> 8),1);
    switch(uVar4) {
    case '\x01':
      return -(uint)(*(double *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)
                    != 0.0) & BSON_TYPE_DOUBLE;
    case '\x02':
    case '\x03':
    case '\x04':
    case '\x05':
    case '\a':
    case '\t':
      return bVar11;
    case '\x06':
    case '\n':
      return BSON_TYPE_EOD;
    case '\b':
      uVar18 = (ulong)*(uint *)&(((bson_json_reader_t *)iter)->producer).buf;
      bVar35 = puVar31[uVar18] == '\0';
      break;
    default:
      if (uVar4 == '\x10') {
        uVar18 = (ulong)*(uint *)&(((bson_json_reader_t *)iter)->producer).buf;
        bVar35 = *(int *)(puVar31 + uVar18) == 0;
      }
      else {
        if (uVar4 != '\x12') {
          return bVar11;
        }
        uVar18 = (ulong)*(uint *)&(((bson_json_reader_t *)iter)->producer).buf;
        bVar35 = *(long *)(puVar31 + uVar18) == 0;
      }
    }
    return (bson_type_t)CONCAT71((int7)(uVar18 >> 8),!bVar35);
  }
  bson_iter_as_bool_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    return (bson_type_t)(((bson_json_reader_t *)iter)->producer).data;
  }
  bson_iter_double_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\x12') {
      return BSON_TYPE_EOD;
    }
    return (bson_type_t)
           *(undefined8 *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
  }
  bson_iter_int64_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    bVar11 = BSON_TYPE_EOD;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x10') {
      bVar11 = *(bson_type_t *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    return bVar11;
  }
  bson_iter_int32_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    bVar3 = puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb];
    bVar11 = (bson_type_t)puVar31;
    if (bVar3 < 0x10) {
      if (bVar3 == 1) {
        return bVar11;
      }
      if ((bVar3 == 8) && (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).buf] != '\0'))
      {
        return bVar11;
      }
    }
    else if ((bVar3 != 0x10) && (bVar3 == 0x12)) {
      return bVar11;
    }
    return bVar11;
  }
  bson_iter_as_double_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    bVar3 = puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb];
    bVar11 = BSON_TYPE_EOD;
    if (bVar3 < 0x10) {
      if (bVar3 == 1) {
        return (bson_type_t)
               (long)*(double *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      if (bVar3 == 8) {
        return (bson_type_t)
               (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).buf] != '\0');
      }
    }
    else if (bVar3 == 0x10) {
      bVar11 = *(bson_type_t *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    else if (bVar3 == 0x12) {
      return (bson_type_t)
             *(undefined8 *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    return bVar11;
  }
  bson_iter_as_int64_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    uVar4 = puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb];
    if (uVar4 == '\x13') {
      lVar16 = *(long *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      lVar7 = *(long *)((long)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) + 8
                       );
      in_RSI->flags = (int)lVar16;
      in_RSI->len = (int)((ulong)lVar16 >> 0x20);
      *(long *)in_RSI->padding = lVar7;
    }
    return (bson_type_t)CONCAT71((int7)((ulong)puVar31 >> 8),uVar4 == '\x13');
  }
  bson_iter_decimal128_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\a') {
      return BSON_TYPE_EOD;
    }
    return (int)puVar31 + *(uint32_t *)&(((bson_json_reader_t *)iter)->producer).buf;
  }
  bson_iter_oid_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\v') {
      bVar11 = *(uint32_t *)&(((bson_json_reader_t *)iter)->producer).buf + (int)puVar31;
      puVar31 = puVar31 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
    }
    else {
      bVar11 = BSON_TYPE_EOD;
      puVar31 = (uint8_t *)0x0;
    }
    if (in_RSI != (bson_t *)0x0) {
      *(uint8_t **)in_RSI = puVar31;
    }
    return bVar11;
  }
  bson_iter_regex_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\x02') {
      if (in_RSI != (bson_t *)0x0) {
        in_RSI->flags = 0;
      }
      return BSON_TYPE_EOD;
    }
    if (in_RSI != (bson_t *)0x0) {
      iVar13 = 1;
      if (1 < *(int *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar13 = *(int *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      in_RSI->flags = iVar13 - 1;
    }
    return (int)puVar31 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
  }
  bson_iter_utf8_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x02') {
      uVar12 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      sVar27 = 1;
      if (1 < (int)*(uint *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        sVar27 = (size_t)*(uint *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)
        ;
      }
      uVar34 = (int)sVar27 - 1;
      pvVar14 = bson_malloc0(sVar27);
      memcpy(pvVar14,puVar31 + uVar12,(ulong)uVar34);
      *(undefined1 *)((long)pvVar14 + (ulong)uVar34) = 0;
    }
    else {
      uVar34 = 0;
      pvVar14 = (void *)0x0;
    }
    if (in_RSI != (bson_t *)0x0) {
      in_RSI->flags = uVar34;
    }
    return (bson_type_t)pvVar14;
  }
  bson_iter_dup_utf8_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\r') {
      if (in_RSI != (bson_t *)0x0) {
        in_RSI->flags = 0;
      }
      return BSON_TYPE_EOD;
    }
    if (in_RSI != (bson_t *)0x0) {
      iVar13 = 1;
      if (1 < *(int *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar13 = *(int *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      in_RSI->flags = iVar13 - 1;
    }
    return (int)puVar31 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
  }
  bson_iter_code_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_codewscope_cold_2();
  }
  else {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\x0f') {
      if (in_RSI != (bson_t *)0x0) {
        in_RSI->flags = 0;
      }
      if (extraout_RDX_01 != (undefined4 *)0x0) {
        *extraout_RDX_01 = 0;
      }
      if (in_RCX != (ulong *)0x0) {
        *in_RCX = 0;
      }
      return BSON_TYPE_EOD;
    }
    if (in_RSI == (bson_t *)0x0) {
LAB_00111197:
      *extraout_RDX_01 =
           *(undefined4 *)
            (puVar31 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf_size + 4));
      *in_RCX = (ulong)(puVar31 +
                       *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf_size + 4));
      return (uint32_t)(((bson_json_reader_t *)iter)->producer).buf_size +
             (int)(((bson_json_reader_t *)iter)->producer).data;
    }
    if (*(int *)(puVar31 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4))
        != 0) {
      in_RSI->flags =
           *(int *)(puVar31 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4)
                   ) - 1;
      goto LAB_00111197;
    }
  }
  bson_iter_codewscope_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    if (extraout_RDX_02 != (ulong *)0x0) {
      *extraout_RDX_02 = 0;
    }
    if (in_RCX != (ulong *)0x0) {
      *in_RCX = 0;
    }
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\f') {
      if (in_RSI != (bson_t *)0x0) {
        uVar12 = *(uint *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        puVar31 = (uint8_t *)(ulong)uVar12;
        in_RSI->flags = uVar12;
        if (uVar12 != 0) {
          puVar31 = (uint8_t *)(ulong)(uVar12 - 1);
          in_RSI->flags = uVar12 - 1;
        }
      }
      if (extraout_RDX_02 != (ulong *)0x0) {
        puVar31 = (uint8_t *)
                  ((long)(((bson_json_reader_t *)iter)->producer).data +
                  (ulong)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4));
        *extraout_RDX_02 = (ulong)puVar31;
      }
      if (in_RCX != (ulong *)0x0) {
        puVar31 = (uint8_t *)
                  ((long)(((bson_json_reader_t *)iter)->producer).data +
                  (ulong)(uint)(((bson_json_reader_t *)iter)->producer).buf_size);
        *in_RCX = (ulong)puVar31;
      }
    }
    return (bson_type_t)puVar31;
  }
  bson_iter_dbpointer_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x0e') {
      bVar11 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4) + (int)puVar31
      ;
      iVar13 = 1;
      if (1 < *(int *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar13 = *(int *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      uVar34 = iVar13 - 1;
    }
    else {
      bVar11 = BSON_TYPE_EOD;
      uVar34 = 0;
    }
    if (in_RSI != (bson_t *)0x0) {
      in_RSI->flags = uVar34;
    }
    return bVar11;
  }
  bson_iter_symbol_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\t') {
      return BSON_TYPE_EOD;
    }
    return (bson_type_t)
           *(undefined8 *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
  }
  bson_iter_date_time_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\t') {
      return BSON_TYPE_EOD;
    }
    return (bson_type_t)
           (*(ulong *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) / 1000);
  }
  bson_iter_time_t_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    uVar34 = 0;
    uVar15 = 0;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x11') {
      uVar15 = *(undefined8 *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      uVar34 = (uint32_t)((ulong)uVar15 >> 0x20);
    }
    if (in_RSI != (bson_t *)0x0) {
      in_RSI->flags = uVar34;
    }
    if (extraout_RDX_03 != (bson_type_t *)0x0) {
      *extraout_RDX_03 = (bson_type_t)uVar15;
    }
    return (bson_type_t)uVar15;
  }
  bson_iter_timestamp_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\t') {
      in_RSI->flags = 0;
      in_RSI->len = 0;
      in_RSI->padding[0] = '\0';
      in_RSI->padding[1] = '\0';
      in_RSI->padding[2] = '\0';
      in_RSI->padding[3] = '\0';
      in_RSI->padding[4] = '\0';
      in_RSI->padding[5] = '\0';
      in_RSI->padding[6] = '\0';
      in_RSI->padding[7] = '\0';
      return (bson_type_t)puVar31;
    }
    lVar16 = *(long *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    *(long *)in_RSI = lVar16 / 1000;
    lVar16 = (lVar16 % 1000) * 1000;
    *(long *)in_RSI->padding = lVar16;
    return (bson_type_t)lVar16;
  }
  bson_iter_timeval_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_visit_all_cold_2();
  }
  else if (in_RSI != (bson_t *)0x0) {
    _Var9 = _bson_iter_next_internal(iter,(char **)&puStack_288,&uStack_290,&_Stack_299);
    if (_Var9) {
      do {
        puVar31 = puStack_288;
        if (*puStack_288 != '\0') {
          sVar17 = strlen((char *)puStack_288);
          _Var9 = bson_utf8_validate((char *)puVar31,sVar17,false);
          if (!_Var9) {
            *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) =
                 *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).cb + 4);
            break;
          }
        }
        if ((*(code **)in_RSI != (code *)0x0) &&
           (uVar18 = (**(code **)in_RSI)(iter,puVar31,extraout_RDX_04), (char)uVar18 != '\0'))
        goto LAB_0011196e;
        switch(uStack_290) {
        case 1:
          pcVar20 = *(code **)(in_RSI->padding + 0x10);
          if (pcVar20 == (code *)0x0) break;
          dVar6 = bson_iter_double(iter);
          uVar18 = (*pcVar20)(SUB84(dVar6,0),iter,puVar31,extraout_RDX_04);
          goto LAB_001118b2;
        case 2:
          pcVar19 = bson_iter_utf8(iter,(uint32_t *)apcStack_280);
          _Var9 = bson_utf8_validate(pcVar19,(ulong)apcStack_280[0] & 0xffffffff,true);
          if (!_Var9) {
LAB_00111968:
            uVar12 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).cb + 4);
            uVar18 = (ulong)uVar12;
            *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) = uVar12;
            goto LAB_0011196e;
          }
          pcVar20 = *(code **)(in_RSI->padding + 0x18);
          goto LAB_001117d4;
        case 3:
          pbStack_298 = (bson_t *)0x0;
          uStack_2a0 = 0;
          bson_iter_document(iter,&uStack_2a0,(uint8_t **)&pbStack_298);
          _Var9 = bson_init_static((bson_t *)apcStack_280,(uint8_t *)pbStack_298,(ulong)uStack_2a0);
          if (_Var9) {
            pcVar20 = *(code **)(in_RSI->padding + 0x20);
            goto LAB_0011181e;
          }
          break;
        case 4:
          pbStack_298 = (bson_t *)0x0;
          uStack_2a0 = 0;
          bson_iter_array(iter,&uStack_2a0,(uint8_t **)&pbStack_298);
          _Var9 = bson_init_static((bson_t *)apcStack_280,(uint8_t *)pbStack_298,(ulong)uStack_2a0);
          if (_Var9) {
            pcVar20 = *(code **)(in_RSI->padding + 0x28);
            goto LAB_0011181e;
          }
          break;
        case 5:
          apcStack_280[0] = (char *)0x0;
          pbStack_298 = (bson_t *)((ulong)pbStack_298 & 0xffffffff00000000);
          uStack_2a0 = 0;
          bson_iter_binary(iter,(bson_subtype_t *)&pbStack_298,&uStack_2a0,(uint8_t **)apcStack_280)
          ;
          if (*(code **)(in_RSI->padding + 0x30) != (code *)0x0) {
            uVar18 = (**(code **)(in_RSI->padding + 0x30))
                               (iter,puVar31,(ulong)pbStack_298 & 0xffffffff,uStack_2a0,
                                apcStack_280[0],extraout_RDX_04);
            goto LAB_001118b2;
          }
          break;
        case 6:
          pcVar20 = *(code **)(in_RSI->padding + 0x38);
          goto LAB_0011178a;
        case 7:
          pcVar20 = *(code **)(in_RSI->padding + 0x40);
          if (pcVar20 != (code *)0x0) {
            pbVar21 = bson_iter_oid(iter);
LAB_001118a3:
            uVar18 = (*pcVar20)(iter,puVar31,pbVar21,extraout_RDX_04);
            goto LAB_001118b2;
          }
          break;
        case 8:
          pcVar20 = *(code **)(in_RSI->padding + 0x48);
          if (pcVar20 != (code *)0x0) {
            _Var9 = bson_iter_bool(iter);
            uVar12 = (uint)_Var9;
LAB_00111710:
            uVar18 = (*pcVar20)(iter,puVar31,uVar12,extraout_RDX_04);
            goto LAB_001118b2;
          }
          break;
        case 9:
          pcVar20 = *(code **)(in_RSI->padding + 0x50);
          if (pcVar20 != (code *)0x0) {
            pbVar21 = (bson_oid_t *)bson_iter_date_time(iter);
            goto LAB_001118a3;
          }
          break;
        case 10:
          pcVar20 = *(code **)(in_RSI->padding + 0x58);
LAB_0011178a:
          if (pcVar20 == (code *)0x0) break;
LAB_00111799:
          uVar18 = (*pcVar20)(iter,puVar31,extraout_RDX_04);
          goto LAB_001118b2;
        case 0xb:
          apcStack_280[0] = (char *)0x0;
          __s = bson_iter_regex(iter,apcStack_280);
          sVar17 = strlen(__s);
          _Var9 = bson_utf8_validate(__s,sVar17,true);
          if (!_Var9) goto LAB_00111968;
          pcVar20 = *(code **)(in_RSI->padding + 0x60);
          pcVar19 = apcStack_280[0];
          if (pcVar20 == (code *)0x0) break;
          goto LAB_0011188b;
        case 0xc:
          uStack_2a0 = 0;
          apcStack_280[0] = (char *)0x0;
          pbStack_298 = (bson_t *)0x0;
          bson_iter_dbpointer(iter,&uStack_2a0,apcStack_280,(bson_oid_t **)&pbStack_298);
          _Var9 = bson_utf8_validate(apcStack_280[0],(ulong)uStack_2a0,true);
          if (!_Var9) goto LAB_00111968;
          pcVar20 = *(code **)(in_RSI->padding + 0x68);
          pcVar19 = apcStack_280[0];
          pbVar28 = pbStack_298;
          if (pcVar20 != (code *)0x0) {
LAB_001115a8:
            uVar18 = (*pcVar20)(iter,puVar31,uStack_2a0,pcVar19,pbVar28,extraout_RDX_04);
            goto LAB_001118b2;
          }
          break;
        case 0xd:
          pcVar19 = bson_iter_code(iter,(uint32_t *)apcStack_280);
          _Var9 = bson_utf8_validate(pcVar19,(ulong)apcStack_280[0] & 0xffffffff,true);
          if (!_Var9) goto LAB_00111968;
          pcVar20 = *(code **)(in_RSI->padding + 0x70);
          goto LAB_001117d4;
        case 0xe:
          pcVar19 = bson_iter_symbol(iter,(uint32_t *)apcStack_280);
          _Var9 = bson_utf8_validate(pcVar19,(ulong)apcStack_280[0] & 0xffffffff,true);
          if (!_Var9) goto LAB_00111968;
          pcVar20 = *(code **)(in_RSI + 1);
LAB_001117d4:
          if (pcVar20 != (code *)0x0) {
            __s = (char *)((ulong)apcStack_280[0] & 0xffffffff);
LAB_0011188b:
            uVar18 = (*pcVar20)(iter,puVar31,__s,pcVar19,extraout_RDX_04);
LAB_001118b2:
            if ((char)uVar18 != '\0') goto LAB_0011196e;
          }
          break;
        case 0xf:
          uStack_2a0 = 0;
          pbStack_298 = (bson_t *)0x0;
          uStack_28c = 0;
          pcVar19 = bson_iter_codewscope(iter,&uStack_2a0,&uStack_28c,(uint8_t **)&pbStack_298);
          _Var9 = bson_utf8_validate(pcVar19,(ulong)uStack_2a0,true);
          if (!_Var9) goto LAB_00111968;
          _Var9 = bson_init_static((bson_t *)apcStack_280,(uint8_t *)pbStack_298,(ulong)uStack_28c);
          if ((_Var9) && (pcVar20 = *(code **)in_RSI[1].padding, pcVar20 != (code *)0x0)) {
            pbVar28 = (bson_t *)apcStack_280;
            goto LAB_001115a8;
          }
          break;
        case 0x10:
          pcVar20 = *(code **)(in_RSI[1].padding + 8);
          if (pcVar20 != (code *)0x0) {
            uVar12 = bson_iter_int32(iter);
            goto LAB_00111710;
          }
          break;
        case 0x11:
          bson_iter_timestamp(iter,(uint32_t *)apcStack_280,(uint32_t *)&pbStack_298);
          if (*(code **)(in_RSI[1].padding + 0x10) != (code *)0x0) {
            uVar18 = (**(code **)(in_RSI[1].padding + 0x10))
                               (iter,puVar31,(ulong)apcStack_280[0] & 0xffffffff,
                                (ulong)pbStack_298 & 0xffffffff,extraout_RDX_04);
            goto LAB_001118b2;
          }
          break;
        case 0x12:
          pcVar20 = *(code **)(in_RSI[1].padding + 0x18);
          if (pcVar20 != (code *)0x0) {
            pbVar21 = (bson_oid_t *)bson_iter_int64(iter);
            goto LAB_001118a3;
          }
          break;
        case 0x13:
          bson_iter_decimal128(iter,(bson_decimal128_t *)apcStack_280);
          pcVar20 = *(code **)(in_RSI[1].padding + 0x38);
LAB_0011181e:
          if (pcVar20 != (code *)0x0) {
            uVar18 = (*pcVar20)(iter,puVar31,(bson_t *)apcStack_280,extraout_RDX_04);
            goto LAB_001118b2;
          }
          break;
        default:
          if (uStack_290 == 0x7f) {
            pcVar20 = *(code **)(in_RSI[1].padding + 0x20);
          }
          else {
            if (uStack_290 != 0xff) break;
            pcVar20 = *(code **)(in_RSI[1].padding + 0x28);
          }
          if (pcVar20 == (code *)0x0) break;
          puVar31 = (uint8_t *)
                    ((long)(((bson_json_reader_t *)iter)->producer).data +
                    (ulong)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).dcb + 4));
          goto LAB_00111799;
        }
        if ((*(code **)in_RSI->padding != (code *)0x0) &&
           (uVar18 = (**(code **)in_RSI->padding)
                               (iter,(uint8_t *)
                                     ((long)(((bson_json_reader_t *)iter)->producer).data +
                                     (ulong)*(uint32_t *)
                                             ((long)&(((bson_json_reader_t *)iter)->producer).dcb +
                                             4)),extraout_RDX_04), (char)uVar18 != '\0')) {
LAB_0011196e:
          return (bson_type_t)CONCAT71((int7)(uVar18 >> 8),1);
        }
        _Var9 = _bson_iter_next_internal(iter,(char **)&puStack_288,&uStack_290,&_Stack_299);
      } while (_Var9);
    }
    if (*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) != 0) {
      if ((_Stack_299 == true) && (*(long *)(in_RSI[1].padding + 0x30) != 0)) {
        sVar17 = strlen((char *)puStack_288);
        _Var9 = bson_utf8_validate((char *)puStack_288,sVar17,false);
        if (_Var9) {
          (**(code **)(in_RSI[1].padding + 0x30))(iter,puStack_288,uStack_290,extraout_RDX_04);
          return BSON_TYPE_EOD;
        }
      }
      if (*(code **)(in_RSI->padding + 8) != (code *)0x0) {
        (**(code **)(in_RSI->padding + 8))(iter,extraout_RDX_04);
      }
    }
    return BSON_TYPE_EOD;
  }
  bson_iter_visit_all_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\b') {
      puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).buf] = (uint8_t)in_RSI;
    }
    return (bson_type_t)puVar31;
  }
  bson_iter_overwrite_bool_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x10') {
      *(int *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) = (int)in_RSI;
    }
    return (bson_type_t)puVar31;
  }
  bson_iter_overwrite_int32_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x12') {
      *(bson_t **)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) = in_RSI;
    }
    return (bson_type_t)puVar31;
  }
  bson_iter_overwrite_int64_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x01') {
      *(ulong *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) =
           CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    }
    return (bson_type_t)puVar31;
  }
  bson_iter_overwrite_double_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x13') {
      uVar12 = *(uint *)&(((bson_json_reader_t *)iter)->producer).buf;
      lVar16 = *(long *)in_RSI->padding;
      *(long *)(puVar31 + uVar12) = *(long *)in_RSI;
      *(long *)((long)(puVar31 + uVar12) + 8) = lVar16;
    }
    return (bson_type_t)puVar31;
  }
  bson_iter_overwrite_decimal128_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_value_cold_1();
    if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
      bson_json_reader_read_cold_2();
    }
    else if (in_RSI != (bson_t *)0x0) {
      (((bson_json_reader_t *)iter)->bson).bson = in_RSI;
      (((bson_json_reader_t *)iter)->bson).n = -1;
      (((bson_json_reader_t *)iter)->bson).read_state = BSON_JSON_REGULAR;
      __s_00 = &bStack_560;
      if (error != (bson_error_t *)0x0) {
        __s_00 = error;
      }
      ((bson_json_reader_t *)iter)->error = __s_00;
      memset(__s_00,0,0x200);
      sVar27 = (((bson_json_reader_t *)iter)->producer).bytes_read;
      bVar35 = false;
      while( true ) {
        sVar5 = ((bson_json_reader_t *)iter)->json->pos;
        if (sVar27 == 0) {
          sVar27 = (*(((bson_json_reader_t *)iter)->producer).cb)
                             ((((bson_json_reader_t *)iter)->producer).data,
                              (((bson_json_reader_t *)iter)->producer).buf,
                              (((bson_json_reader_t *)iter)->producer).buf_size);
        }
        if ((long)sVar27 < 0) {
          if (error != (bson_error_t *)0x0) {
            bson_set_error(error,1,3,"reader cb failed");
            return ~BSON_TYPE_EOD;
          }
          return ~BSON_TYPE_EOD;
        }
        if (sVar27 == 0) break;
        (((bson_json_reader_t *)iter)->producer).bytes_read = sVar27;
        jsonsl_feed(((bson_json_reader_t *)iter)->json,
                    (jsonsl_char_t *)(((bson_json_reader_t *)iter)->producer).buf,sVar27);
        if (((bson_json_reader_t *)iter)->should_reset == true) {
          jsonsl_reset(((bson_json_reader_t *)iter)->json);
          ((bson_json_reader_t *)iter)->should_reset = false;
          puVar31 = (((bson_json_reader_t *)iter)->producer).buf;
          memmove(puVar31,puVar31 + ((bson_json_reader_t *)iter)->advance,
                  sVar27 - ((bson_json_reader_t *)iter)->advance);
          psVar2 = &(((bson_json_reader_t *)iter)->producer).bytes_read;
          *psVar2 = *psVar2 - ((bson_json_reader_t *)iter)->advance;
          goto LAB_00111ddb;
        }
        if (((bson_json_reader_t *)iter)->error->domain != 0) {
          return ~BSON_TYPE_EOD;
        }
        uVar18 = ((bson_json_reader_t *)iter)->json_text_pos;
        if ((uVar18 != 0xffffffffffffffff) &&
           (uVar23 = ((bson_json_reader_t *)iter)->json->pos, uVar22 = uVar23 - uVar18,
           uVar18 <= uVar23 && uVar22 != 0)) {
          if (uVar22 < sVar27) {
            sVar27 = uVar22;
          }
          lVar16 = uVar18 - sVar5;
          if (lVar16 < 1) {
            lVar16 = 0;
          }
          _bson_json_buf_append
                    (&((bson_json_reader_t *)iter)->tok_accumulator,
                     (((bson_json_reader_t *)iter)->producer).buf + lVar16,sVar27);
        }
        (((bson_json_reader_t *)iter)->producer).bytes_read = 0;
        bVar35 = true;
        sVar27 = 0;
      }
      if (!bVar35) {
        return BSON_TYPE_EOD;
      }
LAB_00111ddb:
      if ((((bson_json_reader_t *)iter)->bson).read_state != BSON_JSON_DONE) {
        _bson_json_read_corrupt((bson_json_reader_t *)iter,"%s","Incomplete JSON");
        return ~BSON_TYPE_EOD;
      }
      return BSON_TYPE_DOUBLE;
    }
    bson_json_reader_read_cold_1();
    p_Var26 = (((bson_json_reader_t *)iter)->producer).dcb;
    if (p_Var26 == (bson_json_destroy_cb)0x0) {
      _bson_json_buf_ensure((bson_json_buf_t *)iter,__n + 1);
      pvVar14 = (((bson_json_reader_t *)iter)->producer).data;
    }
    else {
      pvVar14 = (((bson_json_reader_t *)iter)->producer).data;
      if ((((bson_json_reader_t *)iter)->producer).cb < p_Var26 + __n + 1) {
        uVar18 = (ulong)(p_Var26 + __n) >> 1 | (ulong)(p_Var26 + __n);
        uVar18 = uVar18 >> 2 | uVar18;
        uVar18 = uVar18 >> 4 | uVar18;
        uVar18 = uVar18 >> 8 | uVar18;
        uVar18 = uVar18 >> 0x10 | uVar18;
        num_bytes = (bson_json_reader_cb)((uVar18 >> 0x20 | uVar18) + 1);
        (((bson_json_reader_t *)iter)->producer).cb = num_bytes;
        pvVar14 = bson_realloc(pvVar14,(size_t)num_bytes);
        (((bson_json_reader_t *)iter)->producer).data = pvVar14;
      }
    }
    memcpy((bson_json_destroy_cb)
           ((long)pvVar14 + (long)(((bson_json_reader_t *)iter)->producer).dcb),in_RSI,__n);
    p_Var26 = (((bson_json_reader_t *)iter)->producer).dcb + __n;
    (((bson_json_reader_t *)iter)->producer).dcb = p_Var26;
    pvVar14 = (((bson_json_reader_t *)iter)->producer).data;
    p_Var26[(long)pvVar14] = (_func_void_void_ptr)0x0;
    return (bson_type_t)pvVar14;
  }
  puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
  uVar12 = *(uint *)&(((bson_json_reader_t *)iter)->producer).dcb;
  bVar3 = puVar31[uVar12];
  ((bson_value_t *)&(((bson_json_reader_t *)iter)->producer).bytes_parsed)->value_type = (uint)bVar3
  ;
  switch(bVar3) {
  case 1:
    dVar6 = bson_iter_double(iter);
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_double = dVar6;
    break;
  case 2:
    pcVar19 = bson_iter_utf8(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111c23;
  case 3:
    bson_iter_document(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                       (uint8_t **)
                       &((anon_union_24_17_78d57918_for_value *)
                        &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 4:
    bson_iter_array(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                    (uint8_t **)
                    &((anon_union_24_17_78d57918_for_value *)
                     &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 5:
    bson_iter_binary(iter,(bson_subtype_t *)&((bson_json_reader_t *)iter)->field_0x44,
                     (uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                     (uint8_t **)
                     &((anon_union_24_17_78d57918_for_value *)
                      &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 6:
  case 10:
    break;
  case 7:
    pbVar21 = bson_iter_oid(iter);
    dst = (anon_union_24_17_78d57918_for_value *)
          &(((bson_json_reader_t *)iter)->producer).all_whitespace;
    goto LAB_00111b7e;
  case 8:
    _Var9 = bson_iter_bool(iter);
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_bool = _Var9;
    break;
  case 9:
    pcVar19 = (char *)bson_iter_date_time(iter);
    goto LAB_00111c23;
  case 0xb:
    pcVar19 = bson_iter_regex(iter,(char **)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111c23;
  case 0xc:
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int64 = 0;
    pbVar21 = (bson_oid_t *)0x0;
    if (puVar31[uVar12] == '\f') {
      uVar12 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      iVar13 = *(int *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) + -1;
      if (*(int *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) == 0) {
        iVar13 = 0;
      }
      *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar13;
      (((anon_union_24_17_78d57918_for_value *)
       &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_utf8).str =
           (char *)(puVar31 + uVar12);
      pbVar21 = (bson_oid_t *)(puVar31 + (uint)(((bson_json_reader_t *)iter)->producer).buf_size);
    }
    dst = (anon_union_24_17_78d57918_for_value *)&((bson_json_reader_t *)iter)->field_0x44;
LAB_00111b7e:
    bson_oid_copy(pbVar21,&dst->v_oid);
    break;
  case 0xd:
    if (puVar31[uVar12] == '\r') {
      iVar13 = 1;
      if (1 < *(int *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar13 = *(int *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      iVar13 = iVar13 + -1;
      puVar24 = puVar31 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
    }
    else {
      iVar13 = 0;
      puVar24 = (uint8_t *)0x0;
    }
    *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar13;
    goto LAB_00111c30;
  case 0xe:
    if (puVar31[uVar12] == '\x0e') {
      puVar24 = puVar31 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      iVar13 = 1;
      if (1 < *(int *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar13 = *(int *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      iVar13 = iVar13 + -1;
    }
    else {
      puVar24 = (uint8_t *)0x0;
      iVar13 = 0;
    }
    *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar13;
LAB_00111c30:
    (((anon_union_24_17_78d57918_for_value *)
     &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_utf8).str = (char *)puVar24;
    break;
  case 0xf:
    pcVar19 = bson_iter_codewscope
                        (iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x48,
                         (uint32_t *)&((bson_json_reader_t *)iter)->field_0x4c,
                         (uint8_t **)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111c23;
  case 0x10:
    iVar25 = 0;
    if (puVar31[uVar12] == '\x10') {
      iVar25 = *(int32_t *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int32 = iVar25;
    break;
  case 0x11:
    iVar25 = 0;
    uVar15 = 0;
    if (puVar31[uVar12] == '\x11') {
      uVar15 = *(undefined8 *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      iVar25 = (int32_t)((ulong)uVar15 >> 0x20);
    }
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int32 = iVar25;
    *(int *)&(((bson_json_reader_t *)iter)->producer).field_0x3c = (int)uVar15;
    break;
  case 0x12:
    if (puVar31[uVar12] == '\x12') {
      pcVar19 = *(char **)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    else {
      pcVar19 = (char *)0x0;
    }
LAB_00111c23:
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int64 = (int64_t)pcVar19;
    break;
  case 0x13:
    if (puVar31[uVar12] == '\x13') {
      iVar8 = *(int64_t *)
               ((long)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) + 8);
      ((anon_union_24_17_78d57918_for_value *)
      &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64 =
           *(int64_t *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      *(int64_t *)&((bson_json_reader_t *)iter)->field_0x40 = iVar8;
    }
    break;
  default:
    if ((bVar3 != BSON_TYPE_MAXKEY) && (bVar3 != 0xff)) {
      return BSON_TYPE_EOD;
    }
  }
  return (int)iter + 0x30;
  while( true ) {
    uVar33 = (int)uVar18 + 1;
    uVar18 = (ulong)uVar33;
    puVar31 = puVar31 + 1;
    if (uVar12 <= uVar33) break;
LAB_00110d2e:
    if (*puVar31 == '\0') {
      uVar30 = (int)uVar18 + 1;
      goto LAB_00110ab7;
    }
  }
LAB_00110d3e:
  uVar10 = (uint)(((bson_json_reader_t *)iter)->producer).bytes_read;
  goto LAB_00110d0a;
}

Assistant:

bson_type_t
bson_iter_type (const bson_iter_t *iter) /* IN */
{
   BSON_ASSERT (iter);
   BSON_ASSERT (iter->raw);
   BSON_ASSERT (iter->len);

   return bson_iter_type_unsafe (iter);
}